

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_search.c
# Opt level: O0

uint32_t get_block_residue_hash(MACROBLOCK *x,BLOCK_SIZE bsize)

{
  uint32_t uVar1;
  byte in_SIL;
  undefined8 *in_RDI;
  uint32_t hash;
  int16_t *diff;
  int cols;
  int rows;
  
  uVar1 = (*av1_get_crc32c_value)
                    ((void *)(in_RDI[0x4ac2] + 0x4248),(uint8_t *)*in_RDI,
                     (ulong)block_size_high[in_SIL] * 2 * (ulong)block_size_wide[in_SIL]);
  return uVar1 * 0x20 + (uint)in_SIL;
}

Assistant:

static inline uint32_t get_block_residue_hash(MACROBLOCK *x, BLOCK_SIZE bsize) {
  const int rows = block_size_high[bsize];
  const int cols = block_size_wide[bsize];
  const int16_t *diff = x->plane[0].src_diff;
  const uint32_t hash =
      av1_get_crc32c_value(&x->txfm_search_info.mb_rd_record->crc_calculator,
                           (uint8_t *)diff, 2 * rows * cols);
  return (hash << 5) + bsize;
}